

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O2

boolean encode_mcu_AC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_encoder *pjVar2;
  JBLOCKROW paJVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  jpeg_entropy_encoder *pjVar9;
  long lVar10;
  int *piVar11;
  int iVar12;
  _func_void_j_compress_ptr *p_Var13;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    uVar5 = *(uint *)&pjVar2[4].start_pass;
    if (uVar5 == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar2[4].start_pass + 4));
      uVar5 = cinfo->restart_interval;
      *(uint *)((long)&pjVar2[4].start_pass + 4) =
           *(int *)((long)&pjVar2[4].start_pass + 4) + 1U & 7;
    }
    *(uint *)&pjVar2[4].start_pass = uVar5 - 1;
  }
  paJVar3 = *MCU_data;
  iVar1 = cinfo->cur_comp_info[0]->ac_tbl_no;
  uVar5 = cinfo->Se;
  for (uVar6 = (ulong)uVar5; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
    uVar8 = (uint)(*paJVar3)[jpeg_natural_order[uVar6]];
    if ((*paJVar3)[jpeg_natural_order[uVar6]] < 0) {
      uVar8 = -uVar8;
    }
    if (uVar8 >> ((byte)cinfo->Al & 0x1f) != 0) goto LAB_00131e31;
  }
  uVar6 = (ulong)((int)uVar5 >> 0x1f & uVar5);
LAB_00131e31:
  uVar5 = (uint)uVar6;
  for (uVar6 = uVar6 & 0xffffffff; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
    uVar8 = (uint)(*paJVar3)[jpeg_natural_order[uVar6]];
    if ((*paJVar3)[jpeg_natural_order[uVar6]] < 0) {
      uVar8 = -uVar8;
    }
    if (uVar8 >> ((byte)cinfo->Ah & 0x1f) != 0) goto LAB_00131e68;
  }
  uVar6 = (ulong)((int)uVar5 >> 0x1f & uVar5);
LAB_00131e68:
  iVar12 = cinfo->Ss;
LAB_00131e84:
  if ((int)uVar5 < iVar12) {
    if (iVar12 <= cinfo->Se) {
      arith_encode(cinfo,(uchar *)((&pjVar2[9].finish_pass)[iVar1] + (iVar12 * 3 + -3)),1);
    }
    return 1;
  }
  p_Var13 = (&pjVar2[9].finish_pass)[iVar1];
  lVar10 = (long)(iVar12 * 3 + -3);
  if ((int)uVar6 < iVar12) {
    arith_encode(cinfo,(uchar *)(p_Var13 + lVar10),0);
  }
  piVar11 = jpeg_natural_order + iVar12;
  p_Var13 = p_Var13 + lVar10 + 1;
  do {
    iVar12 = iVar12 + 1;
    uVar8 = (uint)(*paJVar3)[*piVar11];
    pjVar9 = pjVar2 + 0xf;
    if ((*paJVar3)[*piVar11] < 0) {
      uVar7 = -uVar8 >> ((byte)cinfo->Al & 0x1f);
      if ((short)uVar7 != 0) {
        if ((uVar7 & 0xffff) != 1) goto LAB_00131f5a;
        uVar7 = 1;
        arith_encode(cinfo,(uchar *)p_Var13,1);
        goto LAB_00131f66;
      }
    }
    else {
      bVar4 = (byte)cinfo->Al & 0x1f;
      uVar7 = uVar8 >> bVar4;
      if (uVar8 >> bVar4 != 0) break;
    }
    arith_encode(cinfo,(uchar *)p_Var13,0);
    piVar11 = piVar11 + 1;
    p_Var13 = p_Var13 + 3;
  } while( true );
  if (uVar7 == 1) {
    arith_encode(cinfo,(uchar *)p_Var13,1);
    uVar7 = 0;
  }
  else {
LAB_00131f5a:
    uVar7 = uVar7 & 1;
    pjVar9 = (jpeg_entropy_encoder *)(p_Var13 + 1);
  }
LAB_00131f66:
  arith_encode(cinfo,(uchar *)pjVar9,uVar7);
  goto LAB_00131e84;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_refine(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, k, ke, kex;
  int v;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  /* Encode the MCU data block */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Section G.1.3.3: Encoding of AC coefficients */

  /* Establish EOB (end-of-block) index */
  for (ke = cinfo->Se; ke > 0; ke--)
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value.
     */
    if ((v = (*block)[jpeg_natural_order[ke]]) >= 0) {
      if (v >>= cinfo->Al) break;
    } else {
      v = -v;
      if (v >>= cinfo->Al) break;
    }

  /* Establish EOBx (previous stage end-of-block) index */
  for (kex = ke; kex > 0; kex--)
    if ((v = (*block)[jpeg_natural_order[kex]]) >= 0) {
      if (v >>= cinfo->Ah) break;
    } else {
      v = -v;
      if (v >>= cinfo->Ah) break;
    }

  /* Figure G.10: Encode_AC_Coefficients_SA */
  for (k = cinfo->Ss; k <= ke; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (k > kex)
      arith_encode(cinfo, st, 0);       /* EOB decision */
    for (;;) {
      if ((v = (*block)[jpeg_natural_order[k]]) >= 0) {
        if (v >>= cinfo->Al) {
          if (v >> 1)                   /* previously nonzero coef */
            arith_encode(cinfo, st + 2, (v & 1));
          else {                        /* newly nonzero coef */
            arith_encode(cinfo, st + 1, 1);
            arith_encode(cinfo, entropy->fixed_bin, 0);
          }
          break;
        }
      } else {
        v = -v;
        if (v >>= cinfo->Al) {
          if (v >> 1)                   /* previously nonzero coef */
            arith_encode(cinfo, st + 2, (v & 1));
          else {                        /* newly nonzero coef */
            arith_encode(cinfo, st + 1, 1);
            arith_encode(cinfo, entropy->fixed_bin, 1);
          }
          break;
        }
      }
      arith_encode(cinfo, st + 1, 0);  st += 3;  k++;
    }
  }
  /* Encode EOB decision only if k <= cinfo->Se */
  if (k <= cinfo->Se) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 1);
  }

  return TRUE;
}